

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O3

void secp256k1_rfc6979_hmac_sha256_initialize
               (secp256k1_rfc6979_hmac_sha256 *rng,uchar *key,size_t keylen)

{
  uchar *key_00;
  size_t keylen_00;
  size_t keylen_01;
  size_t keylen_02;
  secp256k1_hmac_sha256 hmac;
  secp256k1_hmac_sha256 sStack_f8;
  
  builtin_memcpy(rng->v,
                 "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                 ,0x20);
  key_00 = rng->k;
  rng->k[0] = '\0';
  rng->k[1] = '\0';
  rng->k[2] = '\0';
  rng->k[3] = '\0';
  rng->k[4] = '\0';
  rng->k[5] = '\0';
  rng->k[6] = '\0';
  rng->k[7] = '\0';
  rng->k[8] = '\0';
  rng->k[9] = '\0';
  rng->k[10] = '\0';
  rng->k[0xb] = '\0';
  rng->k[0xc] = '\0';
  rng->k[0xd] = '\0';
  rng->k[0xe] = '\0';
  rng->k[0xf] = '\0';
  rng->k[0x10] = '\0';
  rng->k[0x11] = '\0';
  rng->k[0x12] = '\0';
  rng->k[0x13] = '\0';
  rng->k[0x14] = '\0';
  rng->k[0x15] = '\0';
  rng->k[0x16] = '\0';
  rng->k[0x17] = '\0';
  rng->k[0x18] = '\0';
  rng->k[0x19] = '\0';
  rng->k[0x1a] = '\0';
  rng->k[0x1b] = '\0';
  rng->k[0x1c] = '\0';
  rng->k[0x1d] = '\0';
  rng->k[0x1e] = '\0';
  rng->k[0x1f] = '\0';
  secp256k1_hmac_sha256_initialize(&sStack_f8,key_00,keylen);
  secp256k1_sha256_write(&sStack_f8.inner,rng->v,0x20);
  secp256k1_sha256_write(&sStack_f8.inner,"",1);
  secp256k1_sha256_write(&sStack_f8.inner,key,keylen);
  secp256k1_hmac_sha256_finalize(&sStack_f8,key_00);
  secp256k1_hmac_sha256_initialize(&sStack_f8,key_00,keylen_00);
  secp256k1_sha256_write(&sStack_f8.inner,rng->v,0x20);
  secp256k1_hmac_sha256_finalize(&sStack_f8,rng->v);
  secp256k1_hmac_sha256_initialize(&sStack_f8,key_00,keylen_01);
  secp256k1_sha256_write(&sStack_f8.inner,rng->v,0x20);
  secp256k1_sha256_write(&sStack_f8.inner,"\x01",1);
  secp256k1_sha256_write(&sStack_f8.inner,key,keylen);
  secp256k1_hmac_sha256_finalize(&sStack_f8,key_00);
  secp256k1_hmac_sha256_initialize(&sStack_f8,key_00,keylen_02);
  secp256k1_sha256_write(&sStack_f8.inner,rng->v,0x20);
  secp256k1_hmac_sha256_finalize(&sStack_f8,rng->v);
  rng->retry = 0;
  return;
}

Assistant:

static void secp256k1_rfc6979_hmac_sha256_initialize(secp256k1_rfc6979_hmac_sha256 *rng, const unsigned char *key, size_t keylen) {
    secp256k1_hmac_sha256 hmac;
    static const unsigned char zero[1] = {0x00};
    static const unsigned char one[1] = {0x01};

    memset(rng->v, 0x01, 32); /* RFC6979 3.2.b. */
    memset(rng->k, 0x00, 32); /* RFC6979 3.2.c. */

    /* RFC6979 3.2.d. */
    secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
    secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
    secp256k1_hmac_sha256_write(&hmac, zero, 1);
    secp256k1_hmac_sha256_write(&hmac, key, keylen);
    secp256k1_hmac_sha256_finalize(&hmac, rng->k);
    secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
    secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
    secp256k1_hmac_sha256_finalize(&hmac, rng->v);

    /* RFC6979 3.2.f. */
    secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
    secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
    secp256k1_hmac_sha256_write(&hmac, one, 1);
    secp256k1_hmac_sha256_write(&hmac, key, keylen);
    secp256k1_hmac_sha256_finalize(&hmac, rng->k);
    secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
    secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
    secp256k1_hmac_sha256_finalize(&hmac, rng->v);
    rng->retry = 0;
}